

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RunResult __thiscall
wabt::interp::Thread::
DoSimdIsTrue<wabt::interp::Simd<unsigned_short,(unsigned_char)8>,(unsigned_char)1>(Thread *this)

{
  difference_type __n;
  long lVar1;
  long lVar2;
  Simd<unsigned_short,_(unsigned_char)__b_> SVar3;
  Simd<unsigned_short,_(unsigned_char)__b_> val;
  unsigned_short local_18 [8];
  
  SVar3 = Pop<wabt::interp::Simd<unsigned_short,(unsigned_char)8>>(this);
  local_18[0] = SVar3.v[0];
  local_18[1] = SVar3.v[1];
  local_18[2] = SVar3.v[2];
  local_18[3] = SVar3.v[3];
  local_18[4] = SVar3.v[4];
  local_18[5] = SVar3.v[5];
  local_18[6] = SVar3.v[6];
  local_18[7] = SVar3.v[7];
  lVar1 = 0;
  lVar2 = 0;
  do {
    lVar1 = (lVar1 + 1) - (ulong)(*(short *)((long)local_18 + lVar2) == 0);
    lVar2 = lVar2 + 2;
  } while (lVar2 != 0x10);
  Push<bool>(this,lVar1 != 0);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdIsTrue() {
  using L = typename S::LaneType;
  auto val = Pop<S>();
  Push(std::count_if(std::begin(val.v), std::end(val.v),
                     [](L x) { return x != 0; }) >= count);
  return RunResult::Ok;
}